

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rehash.cpp
# Opt level: O2

void __thiscall Jupiter::Rehashable::~Rehashable(Rehashable *this)

{
  list<Jupiter::Rehashable_*,_std::allocator<Jupiter::Rehashable_*>_> *__position;
  
  this->_vptr_Rehashable = (_func_int **)&PTR___cxa_pure_virtual_0015a7e0;
  __position = &o_rehashables_abi_cxx11_;
  do {
    __position = (list<Jupiter::Rehashable_*,_std::allocator<Jupiter::Rehashable_*>_> *)
                 ((_List_node_base *)__position)->_M_next;
    if (__position == &o_rehashables_abi_cxx11_) {
      return;
    }
  } while (((_List_node_base *)((long)__position + 0x10))->_M_next != (_List_node_base *)this);
  std::__cxx11::list<Jupiter::Rehashable_*,_std::allocator<Jupiter::Rehashable_*>_>::erase
            (&o_rehashables_abi_cxx11_,(const_iterator)__position);
  return;
}

Assistant:

Jupiter::Rehashable::~Rehashable()
{
	for (auto node = o_rehashables.begin(); node != o_rehashables.end(); ++node)
	{
		if (*node == this)
		{
			o_rehashables.erase(node);
			break;
		}
	}
}